

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O2

char * Jinx::Impl::GetUtf8CstrByIndex(String *source,int64_t index)

{
  size_t sVar1;
  char *utf8Str;
  ulong uVar2;
  char *pcVar3;
  
  sVar1 = GetStringCount(source);
  utf8Str = (source->_M_dataplus)._M_p;
  if (index - 1U < sVar1) {
    pcVar3 = utf8Str + source->_M_string_length;
    for (uVar2 = 1; (utf8Str < pcVar3 && (uVar2 < (ulong)index)); uVar2 = uVar2 + 1) {
      sVar1 = GetUtf8CharSize(utf8Str);
      utf8Str = utf8Str + sVar1;
    }
  }
  else {
    LogWriteLine(Error,"Attempted to access string %s with out of bounds index %zu",utf8Str,index);
    utf8Str = (char *)0x0;
  }
  return utf8Str;
}

Assistant:

inline_t const char * GetUtf8CstrByIndex(const String & source, int64_t index)
	{
		size_t idx = static_cast<size_t>(index);
		if (idx > GetStringCount(source) || idx < 1)
		{
			LogWriteLine(LogLevel::Error, "Attempted to access string %s with out of bounds index %zu", source.c_str(), idx);
			return nullptr;
		}
		const char * cstr = source.c_str();
		const char * end = cstr + source.size();
		size_t i = 1;
		while (cstr < end && i < idx)
		{
			cstr += GetUtf8CharSize(cstr);
			++i;
		}
		return cstr;
	}